

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lib.c
# Opt level: O0

int EVP_PKEY_digestsign_supports_digest(EVP_PKEY *pkey,OSSL_LIB_CTX *libctx,char *name,char *propq)

{
  EVP_MD_CTX *pEVar1;
  EVP_PKEY *in_RCX;
  char *in_RDX;
  OSSL_LIB_CTX *in_RSI;
  char *in_RDI;
  EVP_MD_CTX *unaff_retaddr;
  EVP_MD_CTX *ctx;
  int rv;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  pEVar1 = EVP_MD_CTX_new();
  if (pEVar1 == (EVP_MD_CTX *)0x0) {
    iVar2 = -1;
  }
  else {
    ERR_set_mark();
    iVar2 = EVP_DigestSignInit_ex
                      (unaff_retaddr,
                       (EVP_PKEY_CTX **)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI,
                       in_RDX,in_RCX,(OSSL_PARAM *)ctx);
    ERR_pop_to_mark();
    EVP_MD_CTX_free((EVP_MD_CTX *)0x2766bd);
  }
  return iVar2;
}

Assistant:

int EVP_PKEY_digestsign_supports_digest(EVP_PKEY *pkey, OSSL_LIB_CTX *libctx,
                                        const char *name, const char *propq)
{
    int rv;
    EVP_MD_CTX *ctx = NULL;

    if ((ctx = EVP_MD_CTX_new()) == NULL)
        return -1;

    ERR_set_mark();
    rv = EVP_DigestSignInit_ex(ctx, NULL, name, libctx,
                               propq, pkey, NULL);
    ERR_pop_to_mark();

    EVP_MD_CTX_free(ctx);
    return rv;
}